

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDPF.cpp
# Opt level: O2

short * __thiscall EDPF::ComputePrewitt3x3(EDPF *this)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  double *pdVar4;
  int iVar5;
  short *__s;
  void *__s_00;
  int i;
  byte *pbVar6;
  int iVar7;
  short *psVar8;
  ulong uVar9;
  long lVar10;
  short *psVar11;
  byte *pbVar12;
  int j;
  long lVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  
  iVar2 = (this->super_ED).width;
  lVar14 = (long)iVar2;
  iVar3 = (this->super_ED).height;
  lVar16 = (long)iVar3;
  uVar9 = 0xffffffffffffffff;
  if (-1 < (int)(lVar16 * lVar14)) {
    uVar9 = lVar16 * lVar14 * 2;
  }
  __s = (short *)operator_new__(uVar9);
  memset(__s,0,lVar14 * 2 * lVar16);
  __s_00 = operator_new__(0x20000);
  memset(__s_00,0,0x20000);
  pbVar6 = (this->super_ED).smoothImg + 2;
  psVar8 = __s + 1;
  lVar10 = 1;
  while (lVar10 < lVar16 + -1) {
    lVar10 = lVar10 + 1;
    psVar11 = psVar8;
    pbVar12 = pbVar6;
    for (lVar13 = 1; lVar13 < lVar14 + -1; lVar13 = lVar13 + 1) {
      iVar15 = ((uint)pbVar12[lVar14] + ((uint)*pbVar12 - (uint)pbVar12[lVar14 * 2 + -2]) +
               ((uint)pbVar12[lVar14 * 2] - (uint)pbVar12[-2])) - (uint)pbVar12[lVar14 + -2];
      iVar5 = -iVar15;
      if (0 < iVar15) {
        iVar5 = iVar15;
      }
      iVar7 = ((uint)pbVar12[lVar14 * 2 + -1] + ((uint)pbVar12[lVar14 * 2] - (uint)pbVar12[-2])) -
              ((uint)pbVar12[-1] + ((uint)*pbVar12 - (uint)pbVar12[lVar14 * 2 + -2]));
      iVar15 = -iVar7;
      if (0 < iVar7) {
        iVar15 = iVar7;
      }
      piVar1 = (int *)((long)__s_00 + (ulong)(uint)(iVar15 + iVar5) * 4);
      *piVar1 = *piVar1 + 1;
      psVar11[lVar14] = (short)(iVar15 + iVar5);
      pbVar12 = pbVar12 + 1;
      psVar11 = psVar11 + 1;
    }
    pbVar6 = pbVar6 + lVar14;
    psVar8 = psVar8 + lVar14;
  }
  for (lVar14 = 0x7ffe; lVar14 != -1; lVar14 = lVar14 + -1) {
    piVar1 = (int *)((long)__s_00 + lVar14 * 4);
    *piVar1 = *piVar1 + *(int *)((long)__s_00 + lVar14 * 4 + 4);
  }
  pdVar4 = this->H;
  for (lVar14 = 0; lVar14 != 0x8000; lVar14 = lVar14 + 1) {
    pdVar4[lVar14] =
         (double)*(int *)((long)__s_00 + lVar14 * 4) / (double)((iVar3 + -2) * (iVar2 + -2));
  }
  operator_delete__(__s_00);
  return __s;
}

Assistant:

short * EDPF::ComputePrewitt3x3()
{
	short *gradImg = new short[width*height];
	memset(gradImg, 0, sizeof(short)*width*height);

	int *grads = new int[MAX_GRAD_VALUE];
	memset(grads, 0, sizeof(int)*MAX_GRAD_VALUE);

	for (int i = 1; i<height - 1; i++) {
		for (int j = 1; j<width - 1; j++) {
			// Prewitt Operator in horizontal and vertical direction
			// A B C
			// D x E
			// F G H
			// gx = (C-A) + (E-D) + (H-F)
			// gy = (F-A) + (G-B) + (H-C)
			//
			// To make this faster: 
			// com1 = (H-A)
			// com2 = (C-F)
			// Then: gx = com1 + com2 + (E-D) = (H-A) + (C-F) + (E-D) = (C-A) + (E-D) + (H-F)
			//       gy = com1 - com2 + (G-B) = (H-A) - (C-F) + (G-B) = (F-A) + (G-B) + (H-C)
			// 
			int com1 = smoothImg[(i + 1)*width + j + 1] - smoothImg[(i - 1)*width + j - 1];
			int com2 = smoothImg[(i - 1)*width + j + 1] - smoothImg[(i + 1)*width + j - 1];

			int gx = abs(com1 + com2 + (smoothImg[i*width + j + 1] - smoothImg[i*width + j - 1]));
			int gy = abs(com1 - com2 + (smoothImg[(i + 1)*width + j] - smoothImg[(i - 1)*width + j]));

			int g = gx + gy;

			gradImg[i*width + j] = g;
			grads[g]++;
		} // end-for
	} //end-for

	 // Compute probability function H
	int size = (width - 2)*(height - 2);
	
	for (int i = MAX_GRAD_VALUE - 1; i>0; i--)
		grads[i - 1] += grads[i];
	
	for (int i = 0; i < MAX_GRAD_VALUE; i++)
		H[i] = (double)grads[i] / ((double)size);

	delete[] grads;
	return gradImg;
}